

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O3

size_t __thiscall
helix::nasdaq::nordic_itch_handler::process_packet(nordic_itch_handler *this,packet_view *packet)

{
  itch_order_book_directory *m;
  size_t sVar1;
  uint64_t uVar2;
  long lVar3;
  
  m = (itch_order_book_directory *)packet->_buf;
  sVar1 = 0;
  switch(m->MsgType) {
  case 'A':
    process_msg(this,(itch_add_order *)m);
    goto LAB_00116c7b;
  case 'C':
    process_msg(this,(itch_order_executed_with_price *)m);
    sVar1 = 0x2f;
    break;
  case 'D':
    process_msg(this,(itch_order_delete *)m);
  case 'B':
    sVar1 = 10;
    break;
  case 'E':
    process_msg(this,(itch_order_executed *)m);
LAB_00116c7b:
    sVar1 = 0x24;
    break;
  case 'F':
    process_msg(this,(itch_add_order_mpid *)m);
    sVar1 = 0x28;
    break;
  case 'H':
    process_msg(this,(itch_order_book_trading_action *)m);
    sVar1 = 0xd;
    break;
  case 'I':
    sVar1 = 0x4b;
    break;
  case 'M':
    lVar3 = 1;
    uVar2 = 0;
    while (m->OrderBook[lVar3 + -1] == ' ') {
      lVar3 = lVar3 + 1;
      if (lVar3 == 4) goto LAB_00116c9f;
    }
    uVar2 = 0;
    for (; lVar3 != 4; lVar3 = lVar3 + 1) {
      uVar2 = ((long)m->OrderBook[lVar3 + -1] + uVar2 * 10) - 0x30;
    }
LAB_00116c9f:
    this->time_msec = uVar2;
    return 4;
  case 'O':
    sVar1 = 5;
    break;
  case 'P':
    process_msg(this,(itch_trade *)m);
    sVar1 = 0x35;
    break;
  case 'Q':
    process_msg(this,(itch_cross_trade *)m);
    sVar1 = 0x2e;
    break;
  case 'R':
    process_msg(this,m);
    sVar1 = 0x41;
    break;
  case 'S':
    sVar1 = 2;
    break;
  case 'T':
    lVar3 = 1;
    uVar2 = 0;
    while (m->OrderBook[lVar3 + -1] == ' ') {
      lVar3 = lVar3 + 1;
      if (lVar3 == 6) goto LAB_00116c54;
    }
    uVar2 = 0;
    for (; lVar3 != 6; lVar3 = lVar3 + 1) {
      uVar2 = ((long)m->OrderBook[lVar3 + -1] + uVar2 * 10) - 0x30;
    }
LAB_00116c54:
    this->time_sec = uVar2;
    return 6;
  case 'X':
    process_msg(this,(itch_order_cancel *)m);
    sVar1 = 0x13;
  }
  return sVar1;
}

Assistant:

size_t nordic_itch_handler::process_packet(const net::packet_view& packet)
{
    auto* msg = packet.cast<itch_message>();
    switch (msg->MsgType) {
    case 'T': return process_msg<itch_seconds>(packet);
    case 'M': return process_msg<itch_milliseconds>(packet);
    case 'O': return process_msg<itch_market_segment_state>(packet);
    case 'S': return process_msg<itch_system_event>(packet);
    case 'R': return process_msg<itch_order_book_directory>(packet);
    case 'H': return process_msg<itch_order_book_trading_action>(packet);
    case 'A': return process_msg<itch_add_order>(packet);
    case 'F': return process_msg<itch_add_order_mpid>(packet);
    case 'E': return process_msg<itch_order_executed>(packet);
    case 'C': return process_msg<itch_order_executed_with_price>(packet);
    case 'X': return process_msg<itch_order_cancel>(packet);
    case 'D': return process_msg<itch_order_delete>(packet);
    case 'P': return process_msg<itch_trade>(packet);
    case 'Q': return process_msg<itch_cross_trade>(packet);
    case 'B': return process_msg<itch_broken_trade>(packet);
    case 'I': return process_msg<itch_noii>(packet);
    default:  return 0;
    }
}